

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EstimatorUtil.h
# Opt level: O2

void TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
               (CGraph *cg,Parameters *params,Count true_triangle_count,
               _func_Estimates_CGraph_ptr_Parameters *func)

{
  string *__rhs;
  Parameters PVar1;
  Parameters params_00;
  Parameters params_01;
  EstimatorStats est_stats_00;
  EstimatorStats est_stats_01;
  FILE *pFVar2;
  int iVar3;
  DIR *__dirp;
  FILE *__stream;
  int *piVar4;
  long lVar5;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  string mkdir;
  string out_filename;
  vector<Estimates,_std::allocator<Estimates>_> estimates;
  undefined8 uStack_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  string directory;
  Estimates est;
  _Vector_base<Estimates,_std::allocator<Estimates>_> local_510;
  EstimatorStats est_stats;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string local_3b8;
  string local_398;
  Parameters local_378;
  Parameters local_2d0;
  Parameters local_228;
  Parameters local_180;
  Parameters local_d8;
  
  estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar5 = 0; lVar5 < params->no_of_repeat; lVar5 = lVar5 + 1) {
    std::chrono::_V2::system_clock::now();
    Parameters::Parameters(&local_d8,params);
    PVar1.filename._M_string_length = uStack_620;
    PVar1.filename._M_dataplus._M_p = (pointer)local_628;
    PVar1.filename.field_2._M_allocated_capacity = local_618;
    PVar1.filename.field_2._8_8_ = uStack_610;
    PVar1.seed_count = local_608;
    PVar1.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)uStack_600;
    PVar1.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_5f8;
    PVar1.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)uStack_5f0;
    PVar1.walk_length = uStack_5e8;
    PVar1.subsample_size = (EdgeIdx)cg;
    PVar1._80_8_ = mkdir._M_dataplus._M_p;
    PVar1._88_24_ = mkdir._8_24_;
    PVar1.algo_name.field_2._M_allocated_capacity = (size_type)out_filename._M_dataplus._M_p;
    PVar1._120_24_ = out_filename._8_24_;
    PVar1.out_directory.field_2._M_allocated_capacity =
         (size_type)
         estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
         super__Vector_impl_data._M_start;
    PVar1.out_directory.field_2._8_8_ =
         estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
         super__Vector_impl_data._M_finish;
    PVar1._160_8_ =
         estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (*func)(&est,cg,PVar1);
    Parameters::~Parameters(&local_d8);
    std::chrono::_V2::system_clock::now();
    std::vector<Estimates,_std::allocator<Estimates>_>::push_back(&estimates,&est);
  }
  std::vector<Estimates,_std::allocator<Estimates>_>::vector
            ((vector<Estimates,_std::allocator<Estimates>_> *)&local_510,&estimates);
  GetErrorStatistics(&est_stats,(vector<Estimates,_std::allocator<Estimates>_> *)&local_510,
                     true_triangle_count);
  std::_Vector_base<Estimates,_std::allocator<Estimates>_>::~_Vector_base(&local_510);
  pFVar2 = _stdout;
  if (params->print_to_console == true) {
    Parameters::Parameters(&local_180,params);
    WriteHeaderInOutput(pFVar2,&local_180,cg,true_triangle_count);
    Parameters::~Parameters(&local_180);
    pFVar2 = _stdout;
    std::__cxx11::string::string((string *)&local_398,(string *)&params->algo_name);
    Parameters::Parameters(&local_228,params);
    params_00.filename._M_string_length = (size_type)est_stats.mean_error_percentage;
    params_00.filename._M_dataplus._M_p = (pointer)est_stats._0_8_;
    params_00.filename.field_2._M_allocated_capacity = (size_type)est_stats.median_error_percentage;
    params_00.filename.field_2._8_8_ = est_stats.stddev_error_percentage;
    params_00.seed_count = (VertexIdx)est_stats.max_error_percentage;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)est_stats.vertices_seen_max_percentage;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)est_stats.edges_seen_max_percentage;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)est_stats.query_complexity_max_percentage;
    params_00.walk_length = uStack_5e8;
    params_00.subsample_size = (EdgeIdx)cg;
    params_00._80_8_ = mkdir._M_dataplus._M_p;
    params_00._88_24_ = mkdir._8_24_;
    params_00.algo_name.field_2._M_allocated_capacity = (size_type)out_filename._M_dataplus._M_p;
    params_00._120_24_ = out_filename._8_24_;
    params_00.out_directory.field_2._M_allocated_capacity =
         (size_type)
         estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
         super__Vector_impl_data._M_start;
    params_00.out_directory.field_2._8_8_ =
         estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
         super__Vector_impl_data._M_finish;
    params_00._160_8_ =
         estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    est_stats_00.mean_error_percentage = (double)true_triangle_count;
    est_stats_00._0_8_ = uStack_580;
    est_stats_00._16_32_ = local_570;
    est_stats_00.edges_seen_max_percentage = (double)directory._M_dataplus._M_p;
    est_stats_00.query_complexity_max_percentage = (double)directory._M_string_length;
    WriteAlgorithmOutput(pFVar2,&local_398,params_00,est_stats_00);
    Parameters::~Parameters(&local_228);
    std::__cxx11::string::~string((string *)&local_398);
    WriteRawData(_stdout,&estimates);
  }
  if (params->print_to_file != true) goto LAB_0010974f;
  GetTimestamp_abi_cxx11_();
  std::__cxx11::string::find_last_of((char *)params,0x10f421);
  std::__cxx11::string::substr((ulong)&out_filename,(ulong)params);
  std::operator+(&local_570,&params->out_directory,&out_filename);
  std::operator+(&mkdir,&local_570,"/");
  __rhs = &params->algo_name;
  std::operator+(&directory,&mkdir,__rhs);
  std::__cxx11::string::~string((string *)&mkdir);
  std::__cxx11::string::~string((string *)&local_570);
  __dirp = opendir(directory._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    piVar4 = __errno_location();
    if (*piVar4 == 2) {
      std::operator+(&mkdir,"mkdir -p ",&directory);
      iVar3 = system(mkdir._M_dataplus._M_p);
      if (iVar3 != -1) {
        std::__cxx11::string::~string((string *)&mkdir);
        goto LAB_0010941b;
      }
      printf("Could not create directory output/%s/%s\n",out_filename._M_dataplus._M_p,
             (__rhs->_M_dataplus)._M_p);
      std::__cxx11::string::~string((string *)&mkdir);
    }
    else {
      printf("Could not create/find directory output/%s/%s\n",out_filename._M_dataplus._M_p,
             (__rhs->_M_dataplus)._M_p);
    }
  }
  else {
    closedir(__dirp);
LAB_0010941b:
    std::operator+(&local_498,&directory,"/");
    std::__cxx11::to_string(&local_4b8,params->sparsification_prob);
    std::operator+(&local_478,&local_498,&local_4b8);
    std::operator+(&local_458,&local_478,"-");
    std::operator+(&local_438,&local_458,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&est);
    std::operator+(&local_418,&local_438,"-");
    std::operator+(&local_3f8,&local_418,&out_filename);
    std::operator+(&local_3d8,&local_3f8,"-");
    std::operator+(&local_570,&local_3d8,__rhs);
    std::operator+(&mkdir,&local_570,".txt");
    std::__cxx11::string::operator=((string *)&out_filename,(string *)&mkdir);
    std::__cxx11::string::~string((string *)&mkdir);
    std::__cxx11::string::~string((string *)&local_570);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_498);
    __stream = fopen(out_filename._M_dataplus._M_p,"w");
    if (__stream == (FILE *)0x0) {
      printf("Could not write output. Please check for write permissions. Lcaoltion: %s\n",
             out_filename._M_dataplus._M_p);
    }
    else {
      Parameters::Parameters(&local_2d0,params);
      WriteHeaderInOutput((FILE *)__stream,&local_2d0,cg,true_triangle_count);
      Parameters::~Parameters(&local_2d0);
      std::__cxx11::string::string((string *)&local_3b8,(string *)__rhs);
      Parameters::Parameters(&local_378,params);
      params_01.filename._M_string_length = (size_type)est_stats.mean_error_percentage;
      params_01.filename._M_dataplus._M_p = (pointer)est_stats._0_8_;
      params_01.filename.field_2._M_allocated_capacity =
           (size_type)est_stats.median_error_percentage;
      params_01.filename.field_2._8_8_ = est_stats.stddev_error_percentage;
      params_01.seed_count = (VertexIdx)est_stats.max_error_percentage;
      params_01.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)est_stats.vertices_seen_max_percentage;
      params_01.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)est_stats.edges_seen_max_percentage;
      params_01.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)est_stats.query_complexity_max_percentage
      ;
      params_01.walk_length = uStack_5e8;
      params_01.subsample_size = (EdgeIdx)cg;
      params_01._80_8_ = mkdir._M_dataplus._M_p;
      params_01._88_24_ = mkdir._8_24_;
      params_01.algo_name.field_2._M_allocated_capacity = (size_type)out_filename._M_dataplus._M_p;
      params_01._120_24_ = out_filename._8_24_;
      params_01.out_directory.field_2._M_allocated_capacity =
           (size_type)
           estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
           super__Vector_impl_data._M_start;
      params_01.out_directory.field_2._8_8_ =
           estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
           super__Vector_impl_data._M_finish;
      params_01._160_8_ =
           estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      est_stats_01.mean_error_percentage = (double)true_triangle_count;
      est_stats_01._0_8_ = uStack_580;
      est_stats_01._16_32_ = local_570;
      est_stats_01.edges_seen_max_percentage = (double)directory._M_dataplus._M_p;
      est_stats_01.query_complexity_max_percentage = (double)directory._M_string_length;
      WriteAlgorithmOutput((FILE *)__stream,&local_3b8,params_01,est_stats_01);
      Parameters::~Parameters(&local_378);
      std::__cxx11::string::~string((string *)&local_3b8);
      WriteRawData((FILE *)__stream,&estimates);
      fclose(__stream);
    }
  }
  std::__cxx11::string::~string((string *)&directory);
  std::__cxx11::string::~string((string *)&out_filename);
  std::__cxx11::string::~string((string *)&est);
LAB_0010974f:
  std::_Vector_base<Estimates,_std::allocator<Estimates>_>::~_Vector_base
            (&estimates.super__Vector_base<Estimates,_std::allocator<Estimates>_>);
  return;
}

Assistant:

void TriangleEstimator (CGraph *cg, Parameters params, Count true_triangle_count, TF func) {
    std::vector<Estimates> estimates;

    for (Count i = 0; i < params.no_of_repeat; i++) {
        auto startTime = std::chrono::high_resolution_clock::now();
        Estimates est = func(cg, params);
        auto endTime = std::chrono::high_resolution_clock::now();
//        std::cout << "Run " << i<<". Time taken for this run = " <<
//                  std::chrono::duration_cast<std::chrono::seconds>(endTime - startTime).count()
//                  << " seconds" << std::endl;
        estimates.push_back(est);
    }
    EstimatorStats est_stats = GetErrorStatistics(estimates, true_triangle_count);

    // Print to console
    if (params.print_to_console) {
        WriteHeaderInOutput(stdout, params, cg, true_triangle_count);
        WriteAlgorithmOutput(stdout, params.algo_name, params, est_stats);
        WriteRawData(stdout,estimates);
    }

    // print to file
    if (params.print_to_file) {
        // take current timestamp
        std::string current_time = GetTimestamp();
        // extract the input filename
        std::string out_filename = params.filename.substr(params.filename.find_last_of("/\\") + 1);

        // create the directory output/filename/algoname, if it already does not exist
        std::string directory = params.out_directory + out_filename + "/" + params.algo_name;
        DIR* dir = opendir(directory.c_str());  // try to open the directory
        if (dir) {
            // Directory exists, go on to create a file in this location
            closedir(dir);
        }
        else if (ENOENT == errno){ // Directory does not exist, try creating one
            std::string mkdir = "mkdir -p " + directory;
            if (std::system(mkdir.c_str()) == -1) {
                printf("Could not create directory output/%s/%s\n", out_filename.c_str(), params.algo_name.c_str());
                return;
            }

        }
        else {
            printf("Could not create/find directory output/%s/%s\n",out_filename.c_str(),params.algo_name.c_str());
            return;
        }

        out_filename = directory + "/" +
                        std::to_string(params.sparsification_prob) + "-" +
                        current_time + "-" + out_filename + "-" + params.algo_name + + ".txt";
        FILE *f = fopen(out_filename.c_str(), "w");
        if (!f) {
            printf("Could not write output. Please check for write permissions. Lcaoltion: %s\n",out_filename.c_str());
            return;
        }
        WriteHeaderInOutput(f, params, cg, true_triangle_count);
        WriteAlgorithmOutput(f, params.algo_name, params, est_stats);
        WriteRawData(f, estimates);

        fclose(f);
    }

}